

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void __thiscall
CorUnix::CPalSynchronizationManager::DiscardAllPendingAPCs
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  CRITICAL_SECTION *pCriticalSection;
  _ThreadApcInfoNode *p_Var1;
  PThreadApcInfoNode pobj;
  
  pCriticalSection = &pthrTarget->m_csLock;
  InternalEnterCriticalSection(pthrCurrent,pCriticalSection);
  pobj = (pthrTarget->apcInfo).m_ptainHead;
  if (pobj != (PThreadApcInfoNode)0x0) {
    (pthrTarget->apcInfo).m_ptainHead = (PThreadApcInfoNode)0x0;
    (pthrTarget->apcInfo).m_ptainTail = (PThreadApcInfoNode)0x0;
    InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
    do {
      p_Var1 = pobj->pNext;
      CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
                (&this->m_cacheThreadApcInfoNodes,pthrCurrent,pobj);
      pobj = p_Var1;
    } while (p_Var1 != (_ThreadApcInfoNode *)0x0);
    return;
  }
  InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
  return;
}

Assistant:

void CPalSynchronizationManager::DiscardAllPendingAPCs(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        ThreadApcInfoNode * ptainNode, * ptainLocalHead;

        // Lock
        pthrTarget->Lock(pthrCurrent);
        ptainLocalHead = pthrTarget->apcInfo.m_ptainHead;
        if (ptainLocalHead)
        {
            pthrTarget->apcInfo.m_ptainHead = NULL;
            pthrTarget->apcInfo.m_ptainTail = NULL;
        }
        // Unlock
        pthrTarget->Unlock(pthrCurrent);

        while (ptainLocalHead)
        {
            ptainNode = ptainLocalHead;
            ptainLocalHead = ptainNode->pNext;

            m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
        }
    }